

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::GetApproxQuantileListAggregateFunction(LogicalType *type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  NotImplementedException *pNVar3;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *in_stack_ffffffffffffff58;
  allocator *paVar4;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  LogicalType *local_10;
  
  local_10 = in_RSI;
  LVar1 = LogicalType::id(in_RSI);
  switch(LVar1) {
  case TINYINT:
    GetTypedApproxQuantileListAggregateFunction<signed_char,signed_char>(in_stack_ffffffffffffff58);
    break;
  case SMALLINT:
    GetTypedApproxQuantileListAggregateFunction<short,short>(in_stack_ffffffffffffff58);
    break;
  case INTEGER:
  case DATE:
  case TIME:
    GetTypedApproxQuantileListAggregateFunction<int,int>(in_stack_ffffffffffffff58);
    break;
  case BIGINT:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
    GetTypedApproxQuantileListAggregateFunction<long,long>(in_stack_ffffffffffffff58);
    break;
  default:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    paVar4 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Unimplemented approximate quantile list aggregate",paVar4);
    duckdb::NotImplementedException::NotImplementedException(pNVar3,local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case DECIMAL:
    PVar2 = LogicalType::InternalType(local_10);
    if (PVar2 == INT128) {
      GetTypedApproxQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
                (in_stack_ffffffffffffff58);
    }
    else if (PVar2 == INT16) {
      GetTypedApproxQuantileListAggregateFunction<short,short>(in_stack_ffffffffffffff58);
    }
    else if (PVar2 == INT32) {
      GetTypedApproxQuantileListAggregateFunction<int,int>(in_stack_ffffffffffffff58);
    }
    else {
      if (PVar2 != INT64) {
        local_45 = 1;
        pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_30,"Unimplemented approximate quantile list decimal aggregate",&local_31);
        duckdb::NotImplementedException::NotImplementedException(pNVar3,local_30);
        local_45 = 0;
        __cxa_throw(pNVar3,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      GetTypedApproxQuantileListAggregateFunction<long,long>(in_stack_ffffffffffffff58);
    }
    break;
  case FLOAT:
    GetTypedApproxQuantileListAggregateFunction<float,float>(in_stack_ffffffffffffff58);
    break;
  case DOUBLE:
    GetTypedApproxQuantileListAggregateFunction<double,double>(in_stack_ffffffffffffff58);
    break;
  case TIME_TZ:
    GetTypedApproxQuantileListAggregateFunction<duckdb::dtime_tz_t,duckdb::dtime_tz_t>
              (in_stack_ffffffffffffff58);
    break;
  case HUGEINT:
    GetTypedApproxQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetApproxQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedApproxQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIME:
		return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::TIME_TZ:
		//	Not binary comparable
		return GetTypedApproxQuantileListAggregateFunction<dtime_tz_t, dtime_tz_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedApproxQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedApproxQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented approximate quantile list decimal aggregate");
		}
	default:
		throw NotImplementedException("Unimplemented approximate quantile list aggregate");
	}
}